

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode Curl_buffer_send(dynbuf *in,Curl_easy *data,curl_off_t *bytes_written,
                         curl_off_t included_body_bytes,int socketindex)

{
  curl_socket_t sockfd;
  connectdata *pcVar1;
  long lVar2;
  char *pcVar3;
  size_t sVar4;
  bool bVar5;
  anon_union_8_12_57927972_for_p aVar6;
  CURLcode CVar7;
  char *pcVar8;
  ulong uVar9;
  char *pcVar10;
  ulong uVar11;
  CURLcode CVar12;
  long lVar13;
  ulong uVar14;
  size_t sVar15;
  ssize_t amount;
  ulong local_50;
  size_t local_48;
  long *local_40;
  anon_union_8_12_57927972_for_p local_38;
  
  pcVar1 = data->conn;
  local_38 = (data->req).p;
  sockfd = pcVar1->sock[socketindex];
  local_40 = bytes_written;
  pcVar8 = Curl_dyn_ptr(in);
  local_48 = Curl_dyn_len(in);
  uVar11 = local_48 - included_body_bytes;
  if ((((pcVar1->handler->flags & 1) == 0) && ((pcVar1->http_proxy).proxytype != CURLPROXY_HTTPS))
     || (pcVar1->httpversion == '\x14')) {
    lVar2 = (data->set).max_send_speed;
    uVar14 = local_48;
    if (lVar2 < included_body_bytes && lVar2 != 0) {
      uVar14 = lVar2 + uVar11;
    }
  }
  else {
    lVar2 = (data->set).max_send_speed;
    CVar7 = Curl_get_upload_buffer(data);
    if (CVar7 != CURLE_OK) {
      Curl_dyn_free(in);
      return CVar7;
    }
    lVar13 = 0;
    if (lVar2 < included_body_bytes) {
      lVar13 = lVar2 - included_body_bytes;
    }
    if (lVar2 == 0) {
      lVar13 = 0;
    }
    uVar9 = (ulong)(data->set).upload_buffer_size;
    uVar14 = lVar13 + local_48;
    if (uVar9 <= lVar13 + local_48) {
      uVar14 = uVar9;
    }
    memcpy((data->state).ulbuf,pcVar8,uVar14);
    pcVar8 = (data->state).ulbuf;
  }
  CVar7 = Curl_write(data,sockfd,pcVar8,uVar14,(ssize_t *)&local_50);
  uVar14 = local_50;
  if (CVar7 != CURLE_OK) goto LAB_00124142;
  uVar9 = uVar11;
  if (local_50 < uVar11) {
    uVar9 = local_50;
  }
  sVar15 = local_50 - uVar9;
  Curl_debug(data,CURLINFO_HEADER_OUT,pcVar8,uVar9);
  if (uVar11 < uVar14) {
    Curl_debug(data,CURLINFO_DATA_OUT,pcVar8 + uVar9,sVar15);
  }
  aVar6 = local_38;
  *local_40 = *local_40 + local_50;
  if (local_38.file == (FILEPROTO *)0x0) {
    if (local_50 == local_48) goto LAB_00124096;
    CVar12 = CURLE_SEND_ERROR;
    bVar5 = false;
  }
  else {
    sVar15 = sVar15 + (data->req).writebytecount;
    (data->req).writebytecount = sVar15;
    Curl_pgrsSetUploadCounter(data,sVar15);
    pcVar8 = (char *)(local_48 - local_50);
    if (pcVar8 == (char *)0x0) {
      (aVar6.http)->sending = HTTPSEND_BODY;
LAB_00124096:
      CVar12 = (CURLcode)sVar15;
      bVar5 = true;
    }
    else {
      pcVar10 = Curl_dyn_ptr(in);
      ((aVar6.http)->backup).fread_func = (data->state).fread_func;
      ((aVar6.http)->backup).fread_in = (data->state).in;
      pcVar3 = (aVar6.file)->freepath;
      ((aVar6.http)->backup).postdata = (aVar6.http)->postdata;
      ((aVar6.http)->backup).postsize = (curl_off_t)pcVar3;
      (data->state).fread_func = readmoredata;
      (data->state).in = data;
      (aVar6.http)->postdata = pcVar10 + local_50;
      (aVar6.file)->freepath = pcVar8;
      (data->req).pendingheader = uVar11 - uVar9;
      pcVar8 = in->bufr;
      sVar15 = in->leng;
      sVar4 = in->toobig;
      ((aVar6.http)->send_buffer).allc = in->allc;
      ((aVar6.http)->send_buffer).toobig = sVar4;
      ((aVar6.http)->send_buffer).bufr = pcVar8;
      ((aVar6.http)->send_buffer).leng = sVar15;
      (aVar6.http)->sending = HTTPSEND_REQUEST;
      bVar5 = false;
      CVar12 = CURLE_OK;
    }
  }
  if (!bVar5) {
    return CVar12;
  }
LAB_00124142:
  Curl_dyn_free(in);
  (data->req).pendingheader = 0;
  return CVar7;
}

Assistant:

CURLcode Curl_buffer_send(struct dynbuf *in,
                          struct Curl_easy *data,
                          /* add the number of sent bytes to this
                             counter */
                          curl_off_t *bytes_written,
                          /* how much of the buffer contains body data */
                          curl_off_t included_body_bytes,
                          int socketindex)
{
  ssize_t amount;
  CURLcode result;
  char *ptr;
  size_t size;
  struct connectdata *conn = data->conn;
  struct HTTP *http = data->req.p.http;
  size_t sendsize;
  curl_socket_t sockfd;
  size_t headersize;

  DEBUGASSERT(socketindex <= SECONDARYSOCKET);

  sockfd = conn->sock[socketindex];

  /* The looping below is required since we use non-blocking sockets, but due
     to the circumstances we will just loop and try again and again etc */

  ptr = Curl_dyn_ptr(in);
  size = Curl_dyn_len(in);

  headersize = size - (size_t)included_body_bytes; /* the initial part that
                                                      isn't body is header */

  DEBUGASSERT(size > (size_t)included_body_bytes);

  result = Curl_convert_to_network(data, ptr, headersize);
  /* Curl_convert_to_network calls failf if unsuccessful */
  if(result) {
    /* conversion failed, free memory and return to the caller */
    Curl_dyn_free(in);
    return result;
  }

  if((conn->handler->flags & PROTOPT_SSL
#ifndef CURL_DISABLE_PROXY
      || conn->http_proxy.proxytype == CURLPROXY_HTTPS
#endif
       )
     && conn->httpversion != 20) {
    /* Make sure this doesn't send more body bytes than what the max send
       speed says. The request bytes do not count to the max speed.
    */
    if(data->set.max_send_speed &&
       (included_body_bytes > data->set.max_send_speed)) {
      curl_off_t overflow = included_body_bytes - data->set.max_send_speed;
      DEBUGASSERT((size_t)overflow < size);
      sendsize = size - (size_t)overflow;
    }
    else
      sendsize = size;

    /* OpenSSL is very picky and we must send the SAME buffer pointer to the
       library when we attempt to re-send this buffer. Sending the same data
       is not enough, we must use the exact same address. For this reason, we
       must copy the data to the uploadbuffer first, since that is the buffer
       we will be using if this send is retried later.
    */
    result = Curl_get_upload_buffer(data);
    if(result) {
      /* malloc failed, free memory and return to the caller */
      Curl_dyn_free(in);
      return result;
    }
    /* We never send more than upload_buffer_size bytes in one single chunk
       when we speak HTTPS, as if only a fraction of it is sent now, this data
       needs to fit into the normal read-callback buffer later on and that
       buffer is using this size.
    */
    if(sendsize > (size_t)data->set.upload_buffer_size)
      sendsize = (size_t)data->set.upload_buffer_size;

    memcpy(data->state.ulbuf, ptr, sendsize);
    ptr = data->state.ulbuf;
  }
  else {
#ifdef CURLDEBUG
    /* Allow debug builds to override this logic to force short initial
       sends
     */
    char *p = getenv("CURL_SMALLREQSEND");
    if(p) {
      size_t altsize = (size_t)strtoul(p, NULL, 10);
      if(altsize)
        sendsize = CURLMIN(size, altsize);
      else
        sendsize = size;
    }
    else
#endif
    {
      /* Make sure this doesn't send more body bytes than what the max send
         speed says. The request bytes do not count to the max speed.
      */
      if(data->set.max_send_speed &&
         (included_body_bytes > data->set.max_send_speed)) {
        curl_off_t overflow = included_body_bytes - data->set.max_send_speed;
        DEBUGASSERT((size_t)overflow < size);
        sendsize = size - (size_t)overflow;
      }
      else
        sendsize = size;
    }
  }

  result = Curl_write(data, sockfd, ptr, sendsize, &amount);

  if(!result) {
    /*
     * Note that we may not send the entire chunk at once, and we have a set
     * number of data bytes at the end of the big buffer (out of which we may
     * only send away a part).
     */
    /* how much of the header that was sent */
    size_t headlen = (size_t)amount>headersize ? headersize : (size_t)amount;
    size_t bodylen = amount - headlen;

    /* this data _may_ contain binary stuff */
    Curl_debug(data, CURLINFO_HEADER_OUT, ptr, headlen);
    if(bodylen)
      /* there was body data sent beyond the initial header part, pass that on
         to the debug callback too */
      Curl_debug(data, CURLINFO_DATA_OUT, ptr + headlen, bodylen);

    /* 'amount' can never be a very large value here so typecasting it so a
       signed 31 bit value should not cause problems even if ssize_t is
       64bit */
    *bytes_written += (long)amount;

    if(http) {
      /* if we sent a piece of the body here, up the byte counter for it
         accordingly */
      data->req.writebytecount += bodylen;
      Curl_pgrsSetUploadCounter(data, data->req.writebytecount);

      if((size_t)amount != size) {
        /* The whole request could not be sent in one system call. We must
           queue it up and send it later when we get the chance. We must not
           loop here and wait until it might work again. */

        size -= amount;

        ptr = Curl_dyn_ptr(in) + amount;

        /* backup the currently set pointers */
        http->backup.fread_func = data->state.fread_func;
        http->backup.fread_in = data->state.in;
        http->backup.postdata = http->postdata;
        http->backup.postsize = http->postsize;

        /* set the new pointers for the request-sending */
        data->state.fread_func = (curl_read_callback)readmoredata;
        data->state.in = (void *)data;
        http->postdata = ptr;
        http->postsize = (curl_off_t)size;

        /* this much data is remaining header: */
        data->req.pendingheader = headersize - headlen;

        http->send_buffer = *in; /* copy the whole struct */
        http->sending = HTTPSEND_REQUEST;

        return CURLE_OK;
      }
      http->sending = HTTPSEND_BODY;
      /* the full buffer was sent, clean up and return */
    }
    else {
      if((size_t)amount != size)
        /* We have no continue-send mechanism now, fail. This can only happen
           when this function is used from the CONNECT sending function. We
           currently (stupidly) assume that the whole request is always sent
           away in the first single chunk.

           This needs FIXing.
        */
        return CURLE_SEND_ERROR;
    }
  }
  Curl_dyn_free(in);

  /* no remaining header data */
  data->req.pendingheader = 0;
  return result;
}